

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O0

uint32_t lzma_mf_hc4_find(lzma_mf *mf,lzma_match *matches)

{
  uint32_t cur_match_00;
  uint32_t pos_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte *cur_00;
  ulong uVar5;
  lzma_match *plVar6;
  uint local_8c;
  uint local_88;
  uint32_t len_best;
  uint32_t cur_match;
  uint32_t delta3;
  uint32_t delta2;
  uint32_t hash_value;
  uint32_t hash_3_value;
  uint32_t hash_2_value;
  uint32_t temp;
  uint32_t matches_count;
  uint32_t pos;
  uint8_t *cur;
  uint32_t len_limit;
  lzma_match *matches_local;
  lzma_mf *mf_local;
  uint64_t x;
  uint local_14;
  
  cur._4_4_ = mf_avail(mf);
  if (cur._4_4_ < mf->nice_len) {
    if (cur._4_4_ < 4) {
      if (mf->action != LZMA_RUN) {
        move_pending(mf);
        return 0;
      }
      __assert_fail("mf->action != LZMA_RUN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                    ,0x170,"uint32_t lzma_mf_hc4_find(lzma_mf *, lzma_match *)");
    }
  }
  else {
    cur._4_4_ = mf->nice_len;
  }
  cur_00 = mf_ptr(mf);
  pos_00 = mf->read_pos + mf->offset;
  hash_2_value = 0;
  uVar1 = lzma_crc32_table[0][*cur_00] ^ (uint)cur_00[1];
  uVar2 = (uVar1 ^ (uint)cur_00[2] << 8) & 0xffff;
  uVar3 = (uVar1 ^ (uint)cur_00[2] << 8 ^ lzma_crc32_table[0][cur_00[3]] << 5) & mf->hash_mask;
  cur_match = pos_00 - mf->hash[uVar1 & 0x3ff];
  uVar4 = pos_00 - mf->hash[uVar2 + 0x400];
  cur_match_00 = mf->hash[uVar3 + 0x10400];
  mf->hash[uVar1 & 0x3ff] = pos_00;
  mf->hash[uVar2 + 0x400] = pos_00;
  mf->hash[uVar3 + 0x10400] = pos_00;
  local_88 = 1;
  if ((cur_match < mf->cyclic_size) && (cur_00[-(ulong)cur_match] == *cur_00)) {
    local_88 = 2;
    matches->len = 2;
    matches->dist = cur_match - 1;
    hash_2_value = 1;
  }
  if (((cur_match != uVar4) && (uVar4 < mf->cyclic_size)) && (cur_00[-(ulong)uVar4] == *cur_00)) {
    local_88 = 3;
    matches[hash_2_value].dist = uVar4 - 1;
    cur_match = uVar4;
    hash_2_value = hash_2_value + 1;
  }
  if (hash_2_value != 0) {
    x._4_4_ = local_88;
    if (cur._4_4_ < local_88) {
      __assert_fail("len <= limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2e,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    if (0x7fffffff < cur._4_4_) {
      __assert_fail("limit <= UINT32_MAX / 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,0x2f,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
LAB_006d2d4b:
    if (x._4_4_ < cur._4_4_) {
      uVar5 = *(long *)(cur_00 + ((ulong)x._4_4_ - (ulong)cur_match)) - *(long *)(cur_00 + x._4_4_);
      if (uVar5 == 0) goto LAB_006d2dad;
      uVar1 = 0;
      for (; (uVar5 & 1) == 0; uVar5 = uVar5 >> 1 | 0x8000000000000000) {
        uVar1 = uVar1 + 1;
      }
      local_8c = (uVar1 >> 3) + x._4_4_;
      if (cur._4_4_ <= local_8c) {
        local_8c = cur._4_4_;
      }
      local_14 = local_8c;
    }
    else {
      local_14 = cur._4_4_;
    }
    local_88 = local_14;
    matches[hash_2_value - 1].len = local_14;
    if (local_14 == cur._4_4_) {
      mf->son[mf->cyclic_pos] = cur_match_00;
      move_pos(mf);
      return hash_2_value;
    }
  }
  if (local_88 < 3) {
    local_88 = 3;
  }
  plVar6 = hc_find_func(cur._4_4_,pos_00,cur_00,cur_match_00,mf->depth,mf->son,mf->cyclic_pos,
                        mf->cyclic_size,matches + hash_2_value,local_88);
  move_pos(mf);
  return (uint32_t)((long)plVar6 - (long)matches >> 3);
LAB_006d2dad:
  x._4_4_ = x._4_4_ + 8;
  goto LAB_006d2d4b;
}

Assistant:

extern uint32_t
lzma_mf_hc4_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(false, 4);

	hash_4_calc();

	uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t delta3
			= pos - mf->hash[FIX_3_HASH_SIZE + hash_3_value];
	const uint32_t cur_match = mf->hash[FIX_4_HASH_SIZE + hash_value];

	mf->hash[hash_2_value ] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_3_value] = pos;
	mf->hash[FIX_4_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 1;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = 2;
		matches[0].len = 2;
		matches[0].dist = delta2 - 1;
		matches_count = 1;
	}

	if (delta2 != delta3 && delta3 < mf->cyclic_size
			&& *(cur - delta3) == *cur) {
		len_best = 3;
		matches[matches_count++].dist = delta3 - 1;
		delta2 = delta3;
	}

	if (matches_count != 0) {
		len_best = lzma_memcmplen(cur - delta2, cur,
				len_best, len_limit);

		matches[matches_count - 1].len = len_best;

		if (len_best == len_limit) {
			hc_skip();
			return matches_count;
		}
	}

	if (len_best < 3)
		len_best = 3;

	hc_find(len_best);
}